

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTPNSymBase::fold_constants(CTPNSymBase *this,CTcPrsSymtab *symtab)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcSymbol *pCVar3;
  undefined4 extraout_var_01;
  
  iVar1 = (*(this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0xc])();
  iVar2 = (*(this->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0xd])(this);
  pCVar3 = CTcPrsSymtab::find(symtab,(textchar_t *)CONCAT44(extraout_var,iVar1),
                              CONCAT44(extraout_var_00,iVar2));
  if (pCVar3 != (CTcSymbol *)0x0) {
    iVar1 = (*(pCVar3->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.
              _vptr_CVmHashEntry[3])(pCVar3);
    if ((CTPNSymBase *)CONCAT44(extraout_var_01,iVar1) != (CTPNSymBase *)0x0) {
      this = (CTPNSymBase *)CONCAT44(extraout_var_01,iVar1);
    }
  }
  return &this->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNSymBase::fold_constants(CTcPrsSymtab *symtab)
{
    CTcSymbol *sym;
    CTcPrsNode *ret;

    /*
     *   Look up my symbol.  At this stage, don't assume a definition;
     *   merely look to see if it's already known.  We don't have enough
     *   information to determine how we should define the symbol, so
     *   leave it undefined until code generation if it's not already
     *   known.  
     */
    sym = symtab->find(get_sym_text(), get_sym_text_len());
    if (sym != 0)
    {
        /* ask the symbol to do the folding */
        ret = sym->fold_constant();

        /* if that succeeded, return it; otherwise, return unchanged */
        return (ret != 0 ? ret : this);
    }
    else
    {
        /* not defined - return myself unchanged */
        return this;
    }
}